

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  cmGeneratorTarget *this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  pointer this_01;
  cmLocalGenerator *lg;
  string *psVar4;
  undefined1 local_250 [16];
  undefined1 local_240 [8];
  string err_1;
  undefined1 local_218 [8];
  string err;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  cmGeneratorTarget *local_178;
  cmGeneratorTarget *target;
  cmLocalGenerator *localGen;
  string targetName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_b0 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  string local_80 [8];
  string val;
  string prop;
  anon_class_16_2_c95d1c49 print_err;
  bool ignoreMissingTarget_local;
  string *executable_local;
  GenVarsT *genVars_local;
  cmQtAutoGenInitializer *this_local;
  
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)&val.field_2 + 8)
  ;
  prop.field_2._8_8_ = this;
  std::operator+(__return_storage_ptr__,genVars->GenNameUpper,"_EXECUTABLE");
  pcVar2 = cmTarget::GetSafeProperty(this->Target->Target,__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,pcVar2,
             (allocator<char> *)
             ((long)&lfbt.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&lfbt.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 3));
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmTarget::GetMakefile(this->Target->Target);
    cmMakefile::GetBacktrace
              ((cmMakefile *)
               &ge.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)&cge,
               (cmListFileBacktrace *)
               &ge.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_b0,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c8,(string *)local_b0);
    this_01 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)local_c8);
    lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
    std::__cxx11::string::string((string *)&local_110);
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       (this_01,lg,&local_e8,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0
                        ,(cmGeneratorExpressionDAGChecker *)0x0,&local_110);
    std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_c8);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_b0);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)
               &ge.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) || (ignoreMissingTarget)) {
      std::make_shared<cmQtAutoGen::CompilerFeatures>();
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                (&genVars->ExecutableFeatures,
                 (shared_ptr<cmQtAutoGen::CompilerFeatures> *)((long)&targetName.field_2 + 8));
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr
                ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)((long)&targetName.field_2 + 8));
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&val.field_2 + 8)," evaluates to an empty value");
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      this_local._7_1_ = 0;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  if (!bVar1) {
    std::__cxx11::string::string((string *)&localGen);
    if ((this->QtVersion).Major == 4) {
      std::__cxx11::string::operator=((string *)&localGen,"Qt4::");
    }
    else if ((this->QtVersion).Major == 5) {
      std::__cxx11::string::operator=((string *)&localGen,"Qt5::");
    }
    else if ((this->QtVersion).Major == 6) {
      std::__cxx11::string::operator=((string *)&localGen,"Qt6::");
    }
    std::__cxx11::string::operator+=((string *)&localGen,(string *)executable);
    target = (cmGeneratorTarget *)cmGeneratorTarget::GetLocalGenerator(this->Target);
    local_178 = cmLocalGenerator::FindGeneratorTargetToUse
                          ((cmLocalGenerator *)target,(string *)&localGen);
    if (local_178 == (cmGeneratorTarget *)0x0) {
      if (ignoreMissingTarget) {
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                  (&genVars->ExecutableFeatures,
                   (shared_ptr<cmQtAutoGen::CompilerFeatures> *)((long)&err.field_2 + 8));
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr
                  ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)((long)&err.field_2 + 8));
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_218,"Could not find ",
                   (allocator<char> *)(err_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(err_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=((string *)local_218,(string *)executable);
        std::__cxx11::string::operator+=((string *)local_218," executable target ");
        std::__cxx11::string::operator+=((string *)local_218,(string *)&localGen);
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),(string *)local_218);
        this_local._7_1_ = 0;
        bVar1 = true;
        std::__cxx11::string::~string((string *)local_218);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&genVars->ExecutableTargetName,(string *)&localGen);
      genVars->ExecutableTarget = local_178;
      bVar1 = cmGeneratorTarget::IsImported(local_178);
      this_00 = local_178;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_1b9);
        cmGeneratorTarget::ImportedGetLocation(&local_198,this_00,&local_1b8);
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator(&local_1b9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"",&local_1e1);
        pcVar2 = cmGeneratorTarget::GetLocation(this_00,&local_1e0);
        std::__cxx11::string::operator=((string *)&genVars->Executable,pcVar2);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
      }
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&localGen);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_240);
      cmQtAutoGenGlobalInitializer::GetCompilerFeatures
                ((cmQtAutoGenGlobalInitializer *)local_250,(string *)this->GlobalInitializer,
                 executable,&genVars->Executable);
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                (&genVars->ExecutableFeatures,(shared_ptr<cmQtAutoGen::CompilerFeatures> *)local_250
                );
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr
                ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)local_250);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&genVars->ExecutableFeatures)
      ;
      if (!bVar1) {
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),(string *)local_240);
        this_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_240);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    std::string msg = genVars.GenNameUpper;
    msg += " for target ";
    msg += this->Target->GetName();
    msg += ": ";
    msg += err;
    cmSystemTools::Error(msg);
  };

  // Custom executable
  {
    std::string const prop = genVars.GenNameUpper + "_EXECUTABLE";
    std::string const val = this->Target->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt =
          this->Target->Target->GetMakefile()->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable =
          cge->Evaluate(this->Target->GetLocalGenerator(), "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Create empty compiler features.
      genVars.ExecutableFeatures =
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    std::string targetName;
    if (this->QtVersion.Major == 4) {
      targetName = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      targetName = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      targetName = "Qt6::";
    }
    targetName += executable;

    // Find target
    cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
    cmGeneratorTarget* target = localGen->FindGeneratorTargetToUse(targetName);
    if (target != nullptr) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = target;
      if (target->IsImported()) {
        genVars.Executable = target->ImportedGetLocation("");
      } else {
        genVars.Executable = target->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        // Create empty compiler features.
        genVars.ExecutableFeatures =
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
        return true;
      }
      std::string err = "Could not find ";
      err += executable;
      err += " executable target ";
      err += targetName;
      print_err(err);
      return false;
    }
  }

  // Get executable features
  {
    std::string err;
    genVars.ExecutableFeatures = this->GlobalInitializer->GetCompilerFeatures(
      executable, genVars.Executable, err);
    if (!genVars.ExecutableFeatures) {
      print_err(err);
      return false;
    }
  }

  return true;
}